

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringReader.cpp
# Opt level: O2

string * __thiscall
StringReader::getLineFromIndex_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t start)

{
  char *pcVar1;
  long lVar2;
  
  for (lVar2 = 0; start + lVar2 < (this->file)._M_string_length; lVar2 = lVar2 + 1) {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)&this->file);
    if ((*pcVar1 == '\n') || (*pcVar1 == '\r')) break;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->file);
  return __return_storage_ptr__;
}

Assistant:

const std::string StringReader::getLineFromIndex(std::size_t start) const {
  std::size_t end = start;
  while (end < this->file.length() && !isNewLine(this->file.at(end))) {
    end++;
  }
  return this->file.substr(start, end - start);
}